

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>
                   (string *__return_storage_ptr__,char (*a) [50],int *b,char (*args) [8],
                   int *args_1,char (*args_2) [8],int *args_3)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_228;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1b8;
  cmAlphaNum local_180;
  cmAlphaNum local_148;
  cmAlphaNum local_110;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [8];
  char (*args_local_2) [8];
  int *args_local_1;
  char (*args_local) [8];
  int *b_local;
  char (*a_local) [50];
  
  local_38 = args_2;
  args_local_2 = (char (*) [8])args_1;
  args_local_1 = (int *)args;
  args_local = (char (*) [8])b;
  b_local = (int *)a;
  a_local = (char (*) [50])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_110,*a);
  cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_d8,
             &cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const&[],int&,char_const&[],int&,char_const&[],int&)
              ::makePair,&local_110);
  cmAlphaNum::cmAlphaNum(&local_148,*(int *)*args_local);
  cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const&[],int&,char_const&[],int&,char_const&[],int&)
              ::makePair,&local_148);
  cmAlphaNum::cmAlphaNum(&local_180,(char *)args_local_1);
  cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const&[],int&,char_const&[],int&,char_const&[],int&)
              ::makePair,&local_180);
  cmAlphaNum::cmAlphaNum(&local_1b8,*(int *)*args_local_2);
  cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const&[],int&,char_const&[],int&,char_const&[],int&)
              ::makePair,&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1f0,*local_38);
  cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const&[],int&,char_const&[],int&,char_const&[],int&)
              ::makePair,&local_1f0);
  cmAlphaNum::cmAlphaNum(&local_228,*args_3);
  cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>(char_const&[],int&,char_const&[],int&,char_const&[],int&)
              ::makePair,&local_228);
  local_48 = &local_d8;
  local_40 = 6;
  views._M_len = 6;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}